

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int geopolyBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  int iVar1;
  sqlite3_index_constraint *psVar2;
  sqlite3_index_constraint_usage *psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)pIdxInfo->nConstraint;
  if (pIdxInfo->nConstraint < 1) {
    uVar5 = uVar4;
  }
  uVar6 = 0xffffffffffffffff;
  lVar7 = 5;
  iVar9 = 0;
  do {
    if (uVar5 == uVar4) {
      if ((int)uVar6 < 0) {
        pIdxInfo->idxNum = 4;
        pIdxInfo->idxStr = "fullscan";
        pIdxInfo->estimatedCost = 3000000.0;
        pIdxInfo->estimatedRows = 100000;
      }
      else {
        pIdxInfo->idxNum = iVar9;
        pIdxInfo->idxStr = "rtree";
        psVar3 = pIdxInfo->aConstraintUsage;
        psVar3[uVar6 & 0xffffffff].argvIndex = 1;
        psVar3[uVar6 & 0xffffffff].omit = '\0';
        pIdxInfo->estimatedCost = 300.0;
        pIdxInfo->estimatedRows = 10;
      }
      return 0;
    }
    psVar2 = pIdxInfo->aConstraint;
    if (*(char *)((long)&psVar2->iColumn + lVar7) != '\0') {
      iVar1 = *(int *)((long)psVar2 + lVar7 + -5);
      if (iVar1 < 0) {
        if (*(char *)((long)psVar2 + lVar7 + -1) == '\x02') {
          pIdxInfo->idxNum = 1;
          pIdxInfo->idxStr = "rowid";
          psVar3 = pIdxInfo->aConstraintUsage;
          psVar3[uVar4].argvIndex = 1;
          psVar3[uVar4].omit = '\x01';
          pIdxInfo->estimatedCost = 30.0;
          pIdxInfo->estimatedRows = 1;
          pIdxInfo->idxFlags = 1;
          return 0;
        }
      }
      else if ((iVar1 == 0) && (uVar8 = (uint)*(byte *)((long)psVar2 + lVar7 + -1), 0x95 < uVar8)) {
        iVar9 = uVar8 - 0x94;
        uVar6 = uVar4 & 0xffffffff;
      }
    }
    uVar4 = uVar4 + 1;
    lVar7 = lVar7 + 0xc;
  } while( true );
}

Assistant:

static int geopolyBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  int ii;
  int iRowidTerm = -1;
  int iFuncTerm = -1;
  int idxNum = 0;
  (void)tab;

  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];
    if( !p->usable ) continue;
    if( p->iColumn<0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ  ){
      iRowidTerm = ii;
      break;
    }
    if( p->iColumn==0 && p->op>=SQLITE_INDEX_CONSTRAINT_FUNCTION ){
      /* p->op==SQLITE_INDEX_CONSTRAINT_FUNCTION for geopoly_overlap()
      ** p->op==(SQLITE_INDEX_CONTRAINT_FUNCTION+1) for geopoly_within().
      ** See geopolyFindFunction() */
      iFuncTerm = ii;
      idxNum = p->op - SQLITE_INDEX_CONSTRAINT_FUNCTION + 2;
    }
  }

  if( iRowidTerm>=0 ){
    pIdxInfo->idxNum = 1;
    pIdxInfo->idxStr = "rowid";
    pIdxInfo->aConstraintUsage[iRowidTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iRowidTerm].omit = 1;
    pIdxInfo->estimatedCost = 30.0;
    pIdxInfo->estimatedRows = 1;
    pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
    return SQLITE_OK;
  }
  if( iFuncTerm>=0 ){
    pIdxInfo->idxNum = idxNum;
    pIdxInfo->idxStr = "rtree";
    pIdxInfo->aConstraintUsage[iFuncTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iFuncTerm].omit = 0;
    pIdxInfo->estimatedCost = 300.0;
    pIdxInfo->estimatedRows = 10;
    return SQLITE_OK;
  }
  pIdxInfo->idxNum = 4;
  pIdxInfo->idxStr = "fullscan";
  pIdxInfo->estimatedCost = 3000000.0;
  pIdxInfo->estimatedRows = 100000;
  return SQLITE_OK;
}